

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O3

uint ** gf_matr_inv(uint **a,uint a_rows,uint a_cols)

{
  uint *puVar1;
  uint *puVar2;
  uint uVar3;
  uint **ppuVar4;
  uint **ppuVar5;
  undefined4 uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  undefined4 in_register_00000034;
  undefined4 *puVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  
  puVar10 = (undefined4 *)CONCAT44(in_register_00000034,a_rows);
  if (a_rows == 2 || a_rows == a_cols) {
    uVar3 = gf_matr_det(a,a_rows,a_cols);
    ppuVar4 = matrix_copy(a,a_rows,a_cols);
    ppuVar5 = matrix_new(a_rows,a_cols);
    puVar1 = ppuVar4[1];
    uVar13 = **ppuVar4;
    **ppuVar4 = puVar1[1];
    puVar1[1] = uVar13;
    if (a_rows != 0) {
      uVar11 = 0;
      do {
        if (a_cols != 0) {
          puVar1 = ppuVar4[uVar11];
          puVar2 = ppuVar5[uVar11];
          uVar12 = 0;
          do {
            uVar8 = (ulong)puVar1[uVar12];
            if (uVar8 != 0 && uVar3 != 0) {
              iVar7 = index_of[uVar8] - index_of[uVar3];
              iVar9 = iVar7 + 0xff;
              if (-1 < iVar7) {
                iVar9 = iVar7;
              }
              uVar13 = alpha_of[iVar9];
            }
            else {
              uVar13 = -(uint)(uVar8 != 0);
            }
            puVar2[uVar12] = uVar13;
            uVar12 = uVar12 + 1;
          } while (a_cols != uVar12);
        }
        uVar11 = uVar11 + 1;
        uVar13 = a_cols;
      } while (uVar11 != a_rows);
    }
    matrix_free(ppuVar4,a_rows,uVar13);
    return ppuVar5;
  }
  gf_matr_inv_cold_1();
  if ((int)a == 2) {
    ppuVar4 = (uint **)calloc(5,4);
    *ppuVar4 = (uint *)0xe700000074;
    ppuVar4[1] = (uint *)0x1e000000d8;
    *(undefined4 *)(ppuVar4 + 2) = 1;
    uVar6 = 5;
  }
  else {
    if ((int)a != 1) {
      return (uint **)0x0;
    }
    ppuVar4 = (uint **)calloc(2,4);
    *ppuVar4 = (uint *)0x100000002;
    uVar6 = 2;
  }
  if (puVar10 != (undefined4 *)0x0) {
    *puVar10 = uVar6;
  }
  return ppuVar4;
}

Assistant:

uint32_t **gf_matr_inv(uint32_t **a, uint32_t a_rows, uint32_t a_cols)
{
    if (a_rows != a_cols && a_rows != 2)
        fatal("gf_matr_inv", "Ainv only for 2x2 matrices\n");

    uint32_t det = gf_matr_det(a, a_rows, a_cols);

    uint32_t **a0 = matrix_copy(a, a_rows, a_cols);
    uint32_t **a0inv = matrix_new(a_rows, a_cols);

    swap(&a0[0][0], &a0[1][1]);

    for (uint32_t i = 0; i < a_rows; i++)
        for (uint32_t j = 0; j < a_cols; j++)
            a0inv[i][j] = gf_div(a0[i][j], det);

    matrix_free(a0, a_rows, a_cols);

    return a0inv;
}